

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFanio.c
# Opt level: O3

Abc_Obj_t * Abc_ObjInsertBetween(Abc_Obj_t *pNodeIn,Abc_Obj_t *pNodeOut,Abc_ObjType_t Type)

{
  int iVar1;
  int *piVar2;
  long lVar3;
  char *pcVar4;
  Abc_Obj_t *pAVar5;
  int *piVar6;
  long lVar7;
  int iVar8;
  char *__format;
  Mem_Step_t *p;
  long lVar9;
  
  lVar3 = (long)(pNodeIn->vFanouts).nSize;
  if (0 < lVar3) {
    lVar7 = 0;
    do {
      if ((pNodeIn->vFanouts).pArray[lVar7] == pNodeOut->Id) {
        lVar3 = (long)(pNodeOut->vFanins).nSize;
        if (0 < lVar3) {
          lVar9 = 0;
          do {
            if ((pNodeOut->vFanins).pArray[lVar9] == pNodeIn->Id) {
              pAVar5 = Abc_NtkCreateObj(pNodeIn->pNtk,Type);
              p = pAVar5->pNtk->pMmStep;
              iVar1 = pNodeIn->Id;
              iVar8 = (pAVar5->vFanins).nSize;
              if (iVar8 == (pAVar5->vFanins).nCap) {
                if (iVar8 == 0) {
                  (pAVar5->vFanins).nCap = 1;
                  iVar8 = 1;
                }
                if (p == (Mem_Step_t *)0x0) {
                  piVar6 = (int *)malloc((long)(iVar8 * 2) << 2);
                }
                else {
                  piVar6 = (int *)Mem_StepEntryFetch(p,iVar8 << 3);
                }
                piVar2 = (pAVar5->vFanins).pArray;
                if (piVar2 != (int *)0x0) {
                  if (0 < (pAVar5->vFanins).nSize) {
                    lVar3 = 0;
                    do {
                      piVar6[lVar3] = piVar2[lVar3];
                      lVar3 = lVar3 + 1;
                    } while (lVar3 < (pAVar5->vFanins).nSize);
                  }
                  if (p == (Mem_Step_t *)0x0) {
                    free(piVar2);
                  }
                  else {
                    Mem_StepEntryRecycle(p,(char *)piVar2,(pAVar5->vFanins).nCap << 2);
                  }
                }
                (pAVar5->vFanins).nCap = (pAVar5->vFanins).nCap << 1;
                (pAVar5->vFanins).pArray = piVar6;
                iVar8 = (pAVar5->vFanins).nSize;
                p = pAVar5->pNtk->pMmStep;
              }
              else {
                piVar6 = (pAVar5->vFanins).pArray;
              }
              (pAVar5->vFanins).nSize = iVar8 + 1;
              piVar6[iVar8] = iVar1;
              iVar1 = pNodeOut->Id;
              iVar8 = (pAVar5->vFanouts).nSize;
              if (iVar8 == (pAVar5->vFanouts).nCap) {
                if (iVar8 == 0) {
                  (pAVar5->vFanouts).nCap = 1;
                  iVar8 = 1;
                }
                if (p == (Mem_Step_t *)0x0) {
                  piVar6 = (int *)malloc((long)(iVar8 * 2) << 2);
                }
                else {
                  piVar6 = (int *)Mem_StepEntryFetch(p,iVar8 << 3);
                }
                piVar2 = (pAVar5->vFanouts).pArray;
                if (piVar2 != (int *)0x0) {
                  if (0 < (pAVar5->vFanouts).nSize) {
                    lVar3 = 0;
                    do {
                      piVar6[lVar3] = piVar2[lVar3];
                      lVar3 = lVar3 + 1;
                    } while (lVar3 < (pAVar5->vFanouts).nSize);
                  }
                  if (p == (Mem_Step_t *)0x0) {
                    free(piVar2);
                  }
                  else {
                    Mem_StepEntryRecycle(p,(char *)piVar2,(pAVar5->vFanouts).nCap << 2);
                  }
                }
                (pAVar5->vFanouts).nCap = (pAVar5->vFanouts).nCap << 1;
                (pAVar5->vFanouts).pArray = piVar6;
                iVar8 = (pAVar5->vFanouts).nSize;
              }
              else {
                piVar6 = (pAVar5->vFanouts).pArray;
              }
              (pAVar5->vFanouts).nSize = iVar8 + 1;
              piVar6[iVar8] = iVar1;
              if ((int)lVar7 < (pNodeIn->vFanouts).nSize) {
                iVar1 = pAVar5->Id;
                (pNodeIn->vFanouts).pArray[lVar7] = iVar1;
                if ((int)lVar9 < (pNodeOut->vFanins).nSize) {
                  (pNodeOut->vFanins).pArray[lVar9] = iVar1;
                  return pAVar5;
                }
              }
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                            ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
            }
            lVar9 = lVar9 + 1;
          } while (lVar3 != lVar9);
        }
        pcVar4 = Abc_ObjName(pNodeIn);
        printf("Node %s is not among",pcVar4);
        pcVar4 = Abc_ObjName(pNodeOut);
        __format = " the fanins of node %s...\n";
        goto LAB_0085cfcb;
      }
      lVar7 = lVar7 + 1;
    } while (lVar3 != lVar7);
  }
  pcVar4 = Abc_ObjName(pNodeOut);
  printf("Node %s is not among",pcVar4);
  pcVar4 = Abc_ObjName(pNodeIn);
  __format = " the fanouts of node %s...\n";
LAB_0085cfcb:
  printf(__format,pcVar4);
  return (Abc_Obj_t *)0x0;
}

Assistant:

Abc_Obj_t * Abc_ObjInsertBetween( Abc_Obj_t * pNodeIn, Abc_Obj_t * pNodeOut, Abc_ObjType_t Type )
{
    Abc_Obj_t * pNodeNew;
    int iFanoutIndex, iFaninIndex;
    // find pNodeOut among the fanouts of pNodeIn
    if ( (iFanoutIndex = Vec_IntFind( &pNodeIn->vFanouts, pNodeOut->Id )) == -1 )
    {
        printf( "Node %s is not among", Abc_ObjName(pNodeOut) );
        printf( " the fanouts of node %s...\n", Abc_ObjName(pNodeIn) );
        return NULL;
    }
    // find pNodeIn among the fanins of pNodeOut
    if ( (iFaninIndex = Vec_IntFind( &pNodeOut->vFanins, pNodeIn->Id )) == -1 )
    {
        printf( "Node %s is not among", Abc_ObjName(pNodeIn) );
        printf( " the fanins of node %s...\n", Abc_ObjName(pNodeOut) );
        return NULL;
    }
    // create the new node
    pNodeNew = Abc_NtkCreateObj( pNodeIn->pNtk, Type );
    // add pNodeIn as fanin and pNodeOut as fanout
    Vec_IntPushMem( pNodeNew->pNtk->pMmStep, &pNodeNew->vFanins,  pNodeIn->Id  );
    Vec_IntPushMem( pNodeNew->pNtk->pMmStep, &pNodeNew->vFanouts, pNodeOut->Id );
    // update the fanout of pNodeIn
    Vec_IntWriteEntry( &pNodeIn->vFanouts, iFanoutIndex, pNodeNew->Id );
    // update the fanin of pNodeOut
    Vec_IntWriteEntry( &pNodeOut->vFanins, iFaninIndex, pNodeNew->Id );
    return pNodeNew;
}